

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirDEFARRAY_add(char *id)

{
  char *id_local;
  
  CDefineTable::Get(&DefineTable,id);
  if (DefineTable.DefArrayList == (CStringsList *)0x0) {
    Error("[DEFARRAY+] unknown array <id>",id,PASS3);
    SkipToEol(&lp);
  }
  else {
    for (; (DefineTable.DefArrayList)->next != (CStringsList *)0x0;
        DefineTable.DefArrayList = (DefineTable.DefArrayList)->next) {
    }
    dirDEFARRAY_parseItems(&(DefineTable.DefArrayList)->next);
  }
  return;
}

Assistant:

static void dirDEFARRAY_add(const char* id) {
	DefineTable.Get(id);
	if (NULL == DefineTable.DefArrayList) {
		Error("[DEFARRAY+] unknown array <id>", id);
		SkipToEol(lp);
		return;
	}
	// array was already defined, seek to the last item in the list
	while (DefineTable.DefArrayList->next) DefineTable.DefArrayList = DefineTable.DefArrayList->next;
	dirDEFARRAY_parseItems(&DefineTable.DefArrayList->next);
	return;
}